

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O3

uint32_t ZiScanDB(char *content,hs_database_t *db,hs_scratch_t *sc)

{
  size_t sVar1;
  uint32_t id;
  uint32_t local_24;
  
  local_24 = 0;
  if ((content != (char *)0x0 && db != (hs_database_t *)0x0) && (local_24 = 0, *content != '\0')) {
    local_24 = 0;
    sVar1 = strlen(content);
    hs_scan(db,content,sVar1 & 0xffffffff,0,sc,ZiOnMatch,&local_24);
  }
  return local_24;
}

Assistant:

uint32_t ZiScanDB(const char* content, const hs_database_t* db, hs_scratch_t* sc)
{
    if (!db || !content || *content == '\0')
    {
        return 0U;
    }

    uint32_t id = 0U;
    hs_error_t err = hs_scan(db, content, strlen(content), 0, sc, ZiOnMatch, &id);
    if (err != HS_SUCCESS)
    {}
    return id;
}